

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void __thiscall
pdqsort_detail::
sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
          (pdqsort_detail *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> a,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c,
          anon_class_16_2_164db4ee comp)

{
  int iVar1;
  int iVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  ComponentData *pCVar5;
  
  pCVar5 = comp.componentData;
  iVar1 = *(int *)this;
  HVar3 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar5->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[*a._M_current]);
  HVar4 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar5->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[iVar1]);
  iVar1 = *(int *)(*(long *)c._M_current + (long)HVar3 * 4);
  iVar2 = *(int *)(*(long *)c._M_current + (long)HVar4 * 4);
  if ((iVar1 == 1) || (iVar2 != 1)) {
    if ((HVar3 < HVar4) && (iVar1 != 1 || iVar2 == 1)) goto LAB_00305a60;
  }
  else {
LAB_00305a60:
    iVar1 = *(int *)this;
    *(int *)this = *a._M_current;
    *a._M_current = iVar1;
  }
  iVar1 = *a._M_current;
  HVar3 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar5->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[*b._M_current]);
  HVar4 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar5->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[iVar1]);
  iVar1 = *(int *)(*(long *)c._M_current + (long)HVar3 * 4);
  iVar2 = *(int *)(*(long *)c._M_current + (long)HVar4 * 4);
  if ((iVar1 == 1) || (iVar2 != 1)) {
    if ((HVar4 <= HVar3) || (iVar1 == 1 && iVar2 != 1)) goto LAB_00305ad6;
  }
  iVar1 = *a._M_current;
  *a._M_current = *b._M_current;
  *b._M_current = iVar1;
LAB_00305ad6:
  iVar1 = *(int *)this;
  HVar3 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar5->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[*a._M_current]);
  HVar4 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar5->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[iVar1]);
  iVar1 = *(int *)(*(long *)c._M_current + (long)HVar3 * 4);
  iVar2 = *(int *)(*(long *)c._M_current + (long)HVar4 * 4);
  if ((iVar1 == 1) || (iVar2 != 1)) {
    if (HVar4 <= HVar3) {
      return;
    }
    if (iVar1 == 1 && iVar2 != 1) {
      return;
    }
  }
  iVar1 = *(int *)this;
  *(int *)this = *a._M_current;
  *a._M_current = iVar1;
  return;
}

Assistant:

inline void sort3(Iter a, Iter b, Iter c, Compare comp) {
        sort2(a, b, comp);
        sort2(b, c, comp);
        sort2(a, b, comp);
    }